

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileParser::IssueError(cmListFileParser *this,string *text)

{
  cmListFileBacktrace lfbt;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_78;
  cmListFileContext lfc;
  
  lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
  lfc.Name._M_string_length = 0;
  lfc.Name.field_2._M_local_buf[0] = '\0';
  lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
  lfc.FilePath._M_string_length = 0;
  lfc.FilePath.field_2._M_local_buf[0] = '\0';
  lfc.Line = 0;
  std::__cxx11::string::assign((char *)&lfc.FilePath);
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &this->Backtrace);
  cmListFileBacktrace::Push((cmListFileBacktrace *)&local_78,(cmListFileContext *)&lfbt);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt,
             &local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,text,&lfbt);
  cmSystemTools::s_FatalErrorOccured = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cmListFileContext::~cmListFileContext(&lfc);
  return;
}

Assistant:

void cmListFileParser::IssueError(const std::string& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, text, lfbt);
  cmSystemTools::SetFatalErrorOccured();
}